

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_max_eigenvalues(Omega_h *this,Int dim,Reals *symms)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Write<double> *this_00;
  Reals RVar2;
  Write<double> local_30;
  Write<double> local_20;
  
  if (dim == 1) {
    Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)symms);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (dim == 2) {
      Write<double>::Write(&local_30,&symms->write_);
      get_max_eigenvalues_dim<2>(this,(Reals *)&local_30);
      this_00 = &local_30;
    }
    else {
      if (dim != 3) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.cpp"
             ,0x27);
      }
      Write<double>::Write(&local_20,&symms->write_);
      get_max_eigenvalues_dim<3>(this,(Reals *)&local_20);
      this_00 = &local_20;
    }
    Write<double>::~Write(this_00);
    pvVar1 = extraout_RDX;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_max_eigenvalues(Int dim, Reals symms) {
  if (dim == 3) return get_max_eigenvalues_dim<3>(symms);
  if (dim == 2) return get_max_eigenvalues_dim<2>(symms);
  if (dim == 1) return symms;
  OMEGA_H_NORETURN(Reals());
}